

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variance_test.cc
# Opt level: O2

void __thiscall
anon_unknown.dwarf_1d6630d::
SubpelVarianceTest<unsigned_int_(*)(const_unsigned_char_*,_int,_int,_int,_const_unsigned_char_*,_int,_unsigned_int_*,_const_unsigned_char_*)>
::RefTest(SubpelVarianceTest<unsigned_int_(*)(const_unsigned_char_*,_int,_int,_int,_const_unsigned_char_*,_int,_unsigned_int_*,_const_unsigned_char_*)>
          *this)

{
  ACMRandom *this_00;
  byte bVar1;
  undefined8 *puVar2;
  int iVar3;
  uint8_t uVar4;
  uint16_t uVar5;
  int iVar6;
  ulong uVar7;
  byte bVar8;
  sbyte sVar9;
  uint uVar10;
  long lVar11;
  long lVar12;
  int j;
  uint uVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  ulong uVar18;
  SEARCH_METHODS *pSVar19;
  uint8_t *puVar20;
  uint8_t *puVar21;
  uint uVar22;
  ulong uVar23;
  undefined2 in_FPUControlWord;
  uint16_t in_FPUTagWord;
  undefined8 in_FPUInstructionPointer;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_100;
  char local_f5;
  int local_f4;
  int local_f0;
  uint32_t sse1;
  ulong local_e8;
  ulong local_e0;
  AssertHelper local_d8;
  aom_bit_depth_t local_cc;
  int local_c8;
  uint32_t var2;
  uint32_t var1;
  uint32_t sse2;
  RegisterStateCheckMMX reg_check_mmx;
  uint16_t *sec16;
  uint16_t *src16;
  
  this_00 = &this->rnd_;
  local_e8 = 0;
  do {
    if ((int)local_e8 == 8) {
      return;
    }
    local_f0 = (int)local_e8 * 2;
    uVar10 = 0;
    while( true ) {
      local_e0 = (ulong)uVar10;
      if (uVar10 == 8) break;
      if ((this->params_).use_high_bit_depth == false) {
        for (lVar14 = 0; uVar7 = (ulong)(this->params_).block_size, lVar14 < (long)uVar7;
            lVar14 = lVar14 + 1) {
          uVar4 = libaom_test::ACMRandom::Rand8(this_00);
          this->src_[lVar14] = uVar4;
          uVar4 = libaom_test::ACMRandom::Rand8(this_00);
          this->sec_[lVar14] = uVar4;
        }
        for (lVar14 = 0;
            lVar14 <= (long)(this->params_).height + (long)(int)uVar7 + (long)(this->params_).width;
            lVar14 = lVar14 + 1) {
          uVar4 = libaom_test::ACMRandom::Rand8(this_00);
          this->ref_[lVar14] = uVar4;
          uVar7 = (ulong)(uint)(this->params_).block_size;
        }
      }
      else {
        for (lVar14 = 0; uVar7 = (ulong)(this->params_).block_size, lVar14 < (long)uVar7;
            lVar14 = lVar14 + 1) {
          uVar5 = libaom_test::ACMRandom::Rand16(this_00);
          *(uint16_t *)(lVar14 * 2 + (long)this->src_ * 2) = uVar5 & (ushort)(this->params_).mask;
          uVar5 = libaom_test::ACMRandom::Rand16(this_00);
          *(uint16_t *)(lVar14 * 2 + (long)this->sec_ * 2) = uVar5 & (ushort)(this->params_).mask;
        }
        for (lVar14 = 0;
            lVar14 <= (long)(this->params_).height + (long)(int)uVar7 + (long)(this->params_).width;
            lVar14 = lVar14 + 1) {
          uVar5 = libaom_test::ACMRandom::Rand16(this_00);
          *(uint16_t *)(lVar14 * 2 + (long)this->ref_ * 2) = uVar5 & (ushort)(this->params_).mask;
          uVar7 = (ulong)(uint)(this->params_).block_size;
        }
      }
      reg_check_mmx.pre_fpu_env_[0]._0_1_ = (char)in_FPUControlWord;
      reg_check_mmx.pre_fpu_env_._12_4_ = SUB84(in_FPUInstructionPointer,0);
      reg_check_mmx.pre_fpu_env_[8] = (uint16_t)((ulong)in_FPUInstructionPointer >> 0x20);
      iVar6 = (this->params_).width;
      iVar3 = (int)local_e0;
      reg_check_mmx.pre_fpu_env_[4] = in_FPUTagWord;
      var1 = (*(this->params_).func)
                       (this->ref_,iVar6 + 1,(int)local_e8,iVar3,this->src_,iVar6,&sse1,this->sec_);
      libaom_test::RegisterStateCheckMMX::~RegisterStateCheckMMX(&reg_check_mmx);
      puVar20 = this->ref_;
      local_f4 = (this->params_).log2width;
      local_c8 = (this->params_).log2height;
      local_f5 = (this->params_).use_high_bit_depth;
      bVar8 = (byte)local_f4;
      uVar22 = 1 << (bVar8 & 0x1f);
      bVar1 = (byte)local_c8 & 0x1f;
      local_cc = (this->params_).bit_depth;
      iVar3 = iVar3 * 2;
      uVar10 = uVar22;
      if (1 << (bVar8 & 0x1f) < 1) {
        uVar10 = 0;
      }
      lVar14 = (long)(int)(uVar22 + 1);
      uVar22 = 1 << bVar1;
      if (1 << bVar1 < 1) {
        uVar22 = 0;
      }
      lVar12 = (long)puVar20 * 2 + 2;
      lVar16 = lVar14 * 2;
      lVar15 = lVar16 + (long)puVar20 * 2 + 2;
      puVar21 = puVar20 + lVar14 + 1;
      puVar20 = puVar20 + 1;
      lVar17 = 0;
      uVar18 = 0;
      uVar7 = 0;
      while (uVar7 != uVar22) {
        lVar11 = (long)((int)uVar7 << (bVar8 & 0x1f));
        for (uVar23 = 0; uVar10 != uVar23; uVar23 = uVar23 + 1) {
          if ((bool)local_f5 == false) {
            iVar6 = ((int)(((uint)puVar20[uVar23] - (uint)puVar20[uVar23 - 1]) * local_f0 + 8) >> 4)
                    + (uint)puVar20[uVar23 - 1];
            iVar6 = ((int)((((uint)puVar21[uVar23 - 1] - iVar6) +
                           ((int)(((uint)puVar21[uVar23] - (uint)puVar21[uVar23 - 1]) * local_f0 + 8
                                 ) >> 4)) * iVar3 + 8) >> 4) +
                    (uint)this->sec_[uVar23 + lVar11] + iVar6;
            uVar13 = (uint)this->src_[uVar23 + lVar11];
          }
          else {
            uVar13 = (uint)*(ushort *)(lVar12 + -2 + uVar23 * 2);
            iVar6 = ((int)((*(ushort *)(lVar12 + uVar23 * 2) - uVar13) * local_f0 + 8) >> 4) +
                    uVar13;
            uVar13 = (uint)*(ushort *)(lVar15 + -2 + uVar23 * 2);
            iVar6 = ((int)(((uVar13 - iVar6) +
                           ((int)((*(ushort *)(lVar15 + uVar23 * 2) - uVar13) * local_f0 + 8) >> 4))
                           * iVar3 + 8) >> 4) +
                    (uint)*(ushort *)((long)this->sec_ * 2 + lVar11 * 2 + uVar23 * 2) + iVar6;
            uVar13 = (uint)*(ushort *)((long)this->src_ * 2 + lVar11 * 2 + uVar23 * 2);
          }
          iVar6 = (iVar6 + 1 >> 1) - uVar13;
          uVar18 = uVar18 + (uint)(iVar6 * iVar6);
          lVar17 = lVar17 + iVar6;
        }
        lVar15 = lVar15 + lVar16;
        lVar12 = lVar12 + lVar16;
        puVar21 = puVar21 + lVar14;
        puVar20 = puVar20 + lVar14;
        uVar7 = uVar7 + 1;
      }
      if (local_cc == AOM_BITS_12) {
        lVar14 = 0x80;
        lVar12 = 8;
        sVar9 = 8;
        lVar16 = 4;
LAB_0070340f:
        uVar18 = lVar14 + uVar18 >> sVar9;
        lVar17 = lVar12 + lVar17 >> (sbyte)lVar16;
      }
      else if (local_cc == AOM_BITS_10) {
        lVar14 = 8;
        sVar9 = 4;
        lVar12 = 2;
        lVar16 = lVar12;
        goto LAB_0070340f;
      }
      sse2 = (uint32_t)uVar18;
      var2 = sse2 - (int)((ulong)(lVar17 * lVar17) >> ((byte)local_c8 + bVar8 & 0x3f));
      testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
                ((internal *)&reg_check_mmx,"sse1","sse2",&sse1,&sse2);
      if ((char)reg_check_mmx.pre_fpu_env_[0] == '\0') {
        testing::Message::Message((Message *)&local_100);
        std::operator<<((ostream *)(local_100._M_head_impl + 0x10),"at position ");
        std::ostream::operator<<(local_100._M_head_impl + 0x10,(int)local_e8);
        std::operator<<((ostream *)(local_100._M_head_impl + 0x10),", ");
        std::ostream::operator<<(local_100._M_head_impl + 0x10,(int)local_e0);
        puVar2 = (undefined8 *)
                 CONCAT44(reg_check_mmx.pre_fpu_env_._12_4_,
                          CONCAT22(reg_check_mmx.pre_fpu_env_[5],reg_check_mmx.pre_fpu_env_[4]));
        pSVar19 = "";
        if (puVar2 != (undefined8 *)0x0) {
          pSVar19 = (SEARCH_METHODS *)*puVar2;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_d8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/variance_test.cc"
                   ,0x594,(char *)pSVar19);
        testing::internal::AssertHelper::operator=(&local_d8,(Message *)&local_100);
        testing::internal::AssertHelper::~AssertHelper(&local_d8);
        if (local_100._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_100._M_head_impl + 8))();
        }
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)(reg_check_mmx.pre_fpu_env_ + 4));
      testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
                ((internal *)&reg_check_mmx,"var1","var2",&var1,&var2);
      if ((char)reg_check_mmx.pre_fpu_env_[0] == '\0') {
        testing::Message::Message((Message *)&local_100);
        std::operator<<((ostream *)(local_100._M_head_impl + 0x10),"at position ");
        std::ostream::operator<<(local_100._M_head_impl + 0x10,(int)local_e8);
        std::operator<<((ostream *)(local_100._M_head_impl + 0x10),", ");
        std::ostream::operator<<(local_100._M_head_impl + 0x10,(int)local_e0);
        puVar2 = (undefined8 *)
                 CONCAT44(reg_check_mmx.pre_fpu_env_._12_4_,
                          CONCAT22(reg_check_mmx.pre_fpu_env_[5],reg_check_mmx.pre_fpu_env_[4]));
        pSVar19 = "";
        if (puVar2 != (undefined8 *)0x0) {
          pSVar19 = (SEARCH_METHODS *)*puVar2;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_d8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/variance_test.cc"
                   ,0x595,(char *)pSVar19);
        testing::internal::AssertHelper::operator=(&local_d8,(Message *)&local_100);
        testing::internal::AssertHelper::~AssertHelper(&local_d8);
        if (local_100._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_100._M_head_impl + 8))();
        }
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)(reg_check_mmx.pre_fpu_env_ + 4));
      uVar10 = (int)local_e0 + 1;
    }
    local_e8 = (ulong)((int)local_e8 + 1);
  } while( true );
}

Assistant:

void SubpelVarianceTest<SubpixAvgVarMxNFunc>::RefTest() {
  for (int x = 0; x < 8; ++x) {
    for (int y = 0; y < 8; ++y) {
      if (!use_high_bit_depth()) {
        for (int j = 0; j < block_size(); j++) {
          src_[j] = rnd_.Rand8();
          sec_[j] = rnd_.Rand8();
        }
        for (int j = 0; j < block_size() + width() + height() + 1; j++) {
          ref_[j] = rnd_.Rand8();
        }
      } else {
        for (int j = 0; j < block_size(); j++) {
          CONVERT_TO_SHORTPTR(src_)[j] = rnd_.Rand16() & mask();
          CONVERT_TO_SHORTPTR(sec_)[j] = rnd_.Rand16() & mask();
        }
        for (int j = 0; j < block_size() + width() + height() + 1; j++) {
          CONVERT_TO_SHORTPTR(ref_)[j] = rnd_.Rand16() & mask();
        }
      }
      uint32_t sse1, sse2;
      uint32_t var1, var2;
      API_REGISTER_STATE_CHECK(var1 = params_.func(ref_, width() + 1, x, y,
                                                   src_, width(), &sse1, sec_));
      var2 = subpel_avg_variance_ref(ref_, src_, sec_, params_.log2width,
                                     params_.log2height, x, y, &sse2,
                                     use_high_bit_depth(), params_.bit_depth);
      EXPECT_EQ(sse1, sse2) << "at position " << x << ", " << y;
      EXPECT_EQ(var1, var2) << "at position " << x << ", " << y;
    }
  }
}